

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void __thiscall
Js::InterpreterStackFrame::
OP_ProfiledNewScObjArray_Impl<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>,true>
          (InterpreterStackFrame *this,
          OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout,
          AuxArray<unsigned_int> *spreadIndices)

{
  undefined8 *puVar1;
  char cVar2;
  ProfileId profileId;
  ProfileId PVar3;
  Type ppvVar4;
  ScriptContext *scriptContext;
  ScriptFunction *caller;
  FunctionBody *pFVar5;
  InterpreterStackFrame *pIVar6;
  code *pcVar7;
  long lVar8;
  bool bVar9;
  uint uVar10;
  RegSlot RVar11;
  RegSlot RVar12;
  Var pvVar13;
  undefined4 *puVar14;
  uint uVar15;
  Type __s;
  Type TVar16;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  Var stackArgs [8];
  Arguments local_78;
  Arguments local_68;
  Arguments local_58;
  undefined1 auStack_48 [8];
  Arguments outArgs;
  
  __s = (Type)&uStack_c8;
  TVar16 = (Type)((ulong)playout->ArgCount | 0x1000000);
  ppvVar4 = *(Type *)(this + 0x28);
  if (spreadIndices == (AuxArray<unsigned_int> *)0x0) {
    outArgs.Values._4_4_ = (uint)playout->Return;
    pvVar13 = *(Var *)(this + (ulong)playout->Function * 8 + 0x160);
    uStack_d0 = 0xa95e3a;
    ValidateRegValue(this,pvVar13,false,true);
    PVar3._0_1_ = playout[1].ArgCount;
    PVar3._1_1_ = playout[1].Return;
    uStack_d0 = 0xa95e5e;
    local_58.Info = TVar16;
    local_58.Values = ppvVar4;
    pvVar13 = ProfilingHelpers::ProfiledNewScObjArray
                        (pvVar13,&local_58,*(ScriptFunction **)(this + 0x80),PVar3,
                         *(ProfileId *)&playout[1].Function);
    uVar15 = outArgs.Values._4_4_;
  }
  else {
    uStack_d0 = 0xa95da6;
    stackArgs[7] = (Var)TVar16;
    uVar10 = JavascriptFunction::GetSpreadSize
                       ((Arguments *)(stackArgs + 7),spreadIndices,*(ScriptContext **)(this + 0x78))
    ;
    outArgs.Info = (Type)0x0;
    uVar15 = (uVar10 & 0xffffff) + 0x1000000;
    auStack_48._4_4_ = 0;
    auStack_48._0_4_ = uVar15;
    if ((uVar10 & 0xffffff) < 9) {
      outArgs.Info = (Type)&uStack_c8;
      uStack_c8 = 0;
      stackArgs[0] = (Var)0x0;
      stackArgs[1] = (Var)0x0;
      stackArgs[2] = (Var)0x0;
      stackArgs[3] = (Var)0x0;
      stackArgs[4] = (Var)0x0;
      stackArgs[5] = (Var)0x0;
      stackArgs[6] = (Var)0x0;
      __s = (Type)&uStack_c8;
    }
    else {
      uStack_d0 = 0xa95de6;
      ThreadContext::ProbeStack
                ((*(ScriptContext **)(this + 0x78))->threadContext,
                 (ulong)(uVar15 & 0xffffff) * 8 + 0xc00,*(ScriptContext **)(this + 0x78),(PVOID)0x0)
      ;
      uVar15 = (auStack_48._0_4_ & 0xffffff) * 8;
      lVar8 = -(ulong)(uVar15 + 0xf & 0xfffffff0);
      __s = (Type)((long)stackArgs + lVar8 + -8);
      outArgs.Info = __s;
      *(undefined8 *)((long)&uStack_d0 + lVar8) = 0xa95e0e;
      memset((void *)__s,0,(ulong)uVar15);
    }
    scriptContext = *(ScriptContext **)(this + 0x78);
    local_78.Info = TVar16;
    local_78.Values = ppvVar4;
    *(undefined8 *)((long)__s + -8) = 0xa95ea4;
    JavascriptFunction::SpreadArgs(&local_78,(Arguments *)auStack_48,spreadIndices,scriptContext);
    cVar2 = playout->Return;
    pvVar13 = *(Var *)(this + (ulong)playout->Function * 8 + 0x160);
    *(undefined8 *)((long)__s + -8) = 0xa95ec8;
    ValidateRegValue(this,pvVar13,false,true);
    local_68.Info = (Type)auStack_48;
    local_68.Values = (Type)outArgs.Info;
    caller = *(ScriptFunction **)(this + 0x80);
    profileId._0_1_ = playout[1].ArgCount;
    profileId._1_1_ = playout[1].Return;
    PVar3 = *(ProfileId *)&playout[1].Function;
    *(undefined8 *)((long)__s + -8) = 0xa95eed;
    pvVar13 = ProfilingHelpers::ProfiledNewScObjArray(pvVar13,&local_68,caller,profileId,PVar3);
    uVar15 = (int)cVar2;
  }
  *(undefined8 *)((long)__s + -8) = 0xa95efb;
  SetReg<unsigned_int>(this,uVar15,pvVar13);
  pFVar5 = *(FunctionBody **)(this + 0x88);
  puVar1 = (undefined8 *)(*(long *)(this + 0x30) + ~(ulong)playout->ArgCount * 8);
  *(undefined8 **)(this + 0x30) = puVar1;
  *(undefined8 *)(this + 0x28) = *puVar1;
  *(undefined8 *)((long)__s + -8) = 0xa95f21;
  RVar11 = FunctionBody::GetLocalsCount(pFVar5);
  pIVar6 = *(InterpreterStackFrame **)(this + 0x30);
  if (this + (ulong)RVar11 * 8 + 0x160 <= pIVar6) {
    pFVar5 = *(FunctionBody **)(this + 0x88);
    *(undefined8 *)((long)__s + -8) = 0xa95f49;
    RVar11 = FunctionBody::GetLocalsCount(pFVar5);
    pFVar5 = *(FunctionBody **)(this + 0x88);
    *(undefined8 *)((long)__s + -8) = 0xa95f5b;
    RVar12 = FunctionBody::GetOutParamMaxDepth(pFVar5);
    if (pIVar6 < this + (ulong)RVar12 * 8 + (ulong)RVar11 * 8 + 0x160) {
      return;
    }
  }
  AssertCount = AssertCount + 1;
  *(undefined8 *)((long)__s + -8) = 0xa95f74;
  Throw::LogAssert();
  *(undefined8 *)((long)__s + -8) = 0xa95f84;
  puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar14 = 1;
  *(undefined8 *)((long)__s + -8) = 0xa95fac;
  bVar9 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                              ,0x9ac,
                              "(m_localSlots + this->m_functionBody->GetLocalsCount() <= m_outSp && m_outSp < (m_localSlots + this->m_functionBody->GetLocalsCount() + this->m_functionBody->GetOutParamMaxDepth()))"
                              ,"out args Stack pointer not in range after Pop");
  if (bVar9) {
    *puVar14 = 0;
    return;
  }
  pcVar7 = (code *)invalidInstructionException();
  (*pcVar7)();
}

Assistant:

void InterpreterStackFrame::OP_ProfiledNewScObjArray_Impl(const unaligned T* playout, const Js::AuxArray<uint32> *spreadIndices)
    {
        // Always profile this operation when auto-profiling so that array type changes are tracked
#if ENABLE_PROFILE_INFO
        if (!Profiled && !isAutoProfiling)
#else
        Assert(!Profiled);
#endif
        {
            OP_NewScObjArray_Impl<T, Profiled>(playout, spreadIndices);
            return;
        }

#if ENABLE_PROFILE_INFO
        Arguments args(CallInfo(CallFlags_New, playout->ArgCount), m_outParams);

        uint32 spreadSize = 0;
        if (spreadIndices != nullptr)
        {
            spreadSize = JavascriptFunction::GetSpreadSize(args, spreadIndices, scriptContext);

            // Allocate room on the stack for the spread args.
            Arguments outArgs(CallInfo(CallFlags_New, 0), nullptr);
            outArgs.Info.Count = spreadSize;
            const unsigned STACK_ARGS_ALLOCA_THRESHOLD = 8; // Number of stack args we allow before using _alloca
            Var stackArgs[STACK_ARGS_ALLOCA_THRESHOLD];
            size_t outArgsSize = 0;
            if (outArgs.Info.Count > STACK_ARGS_ALLOCA_THRESHOLD)
            {
                PROBE_STACK(scriptContext, outArgs.Info.Count * sizeof(Var) + Js::Constants::MinStackDefault); // args + function call
                outArgsSize = outArgs.Info.Count * sizeof(Var);
                outArgs.Values = (Var*)_alloca(outArgsSize);
                ZeroMemory(outArgs.Values, outArgsSize);
            }
            else
            {
                outArgs.Values = stackArgs;
                outArgsSize = STACK_ARGS_ALLOCA_THRESHOLD * sizeof(Var);
                ZeroMemory(outArgs.Values, outArgsSize); // We may not use all of the elements
            }
            JavascriptFunction::SpreadArgs(args, outArgs, spreadIndices, scriptContext);

            SetReg(
                (RegSlot)playout->Return,
                ProfilingHelpers::ProfiledNewScObjArray(
                    GetReg(playout->Function),
                    outArgs,
                    function,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId2));
        }
        else
        {
            SetReg(
                (RegSlot)playout->Return,
                ProfilingHelpers::ProfiledNewScObjArray(
                    GetReg(playout->Function),
                    args,
                    function,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId,
                    static_cast<const unaligned OpLayoutDynamicProfile2<T> *>(playout)->profileId2));
        }
        PopOut(playout->ArgCount);
#endif
    }